

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O2

void __thiscall EmmyDebuggerManager::RefreshLineSet(EmmyDebuggerManager *this)

{
  __shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<BreakPoint> bp;
  __shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->lineSet)._M_t);
  p_Var1 = &((this->breakpoints).
             super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var2 = &((this->breakpoints).
                  super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>; p_Var2 != p_Var1;
      p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_40,p_Var2);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &this->lineSet,&(local_40._M_ptr)->line);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  return;
}

Assistant:

void EmmyDebuggerManager::RefreshLineSet()
{
	lineSet.clear();
	for (auto bp : breakpoints)
	{
		lineSet.insert(bp->line);
	}
}